

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O2

MaskImage * __thiscall
DataSourceCustom::get_sprite_parts
          (MaskImage *__return_storage_ptr__,DataSourceCustom *this,Resource res,size_t index)

{
  ConfigFile *pCVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ResInfo *pRVar7;
  ostream *poVar8;
  undefined1 local_288 [44];
  int local_25c;
  string image_file_name;
  PSpriteFile image;
  PSpriteFile mask;
  string local_218;
  string mask_file_name;
  string section;
  stringstream stream;
  undefined1 local_1a8 [376];
  
  pRVar7 = get_info(this,res);
  if (pRVar7 == (ResInfo *)0x0) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar8 = std::operator<<(local_1a8,0x30);
    *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__cxx11::stringbuf::str();
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image_file_name,"delta_x",(allocator<char> *)local_288);
    mask_file_name._M_dataplus._M_p._0_4_ = 0;
    local_25c = ConfigFile::value<int>(pCVar1,&section,&image_file_name,(int *)&mask_file_name);
    std::__cxx11::string::~string((string *)&image_file_name);
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image_file_name,"delta_y",(allocator<char> *)local_288);
    mask_file_name._M_dataplus._M_p._0_4_ = 0;
    iVar4 = ConfigFile::value<int>(pCVar1,&section,&image_file_name,(int *)&mask_file_name);
    std::__cxx11::string::~string((string *)&image_file_name);
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image_file_name,"offset_x",(allocator<char> *)local_288);
    mask_file_name._M_dataplus._M_p._0_4_ = 0;
    iVar5 = ConfigFile::value<int>(pCVar1,&section,&image_file_name,(int *)&mask_file_name);
    std::__cxx11::string::~string((string *)&image_file_name);
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image_file_name,"offset_y",(allocator<char> *)local_288);
    mask_file_name._M_dataplus._M_p._0_4_ = 0;
    iVar6 = ConfigFile::value<int>(pCVar1,&section,&image_file_name,(int *)&mask_file_name);
    std::__cxx11::string::~string((string *)&image_file_name);
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mask_file_name,"image_path",(allocator<char> *)&local_218);
    local_288._0_8_ = local_288 + 0x10;
    local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288[0x10] = '\0';
    ConfigFile::value(&image_file_name,pCVar1,&section,&mask_file_name,(string *)local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)&mask_file_name);
    pCVar1 = (pRVar7->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,"mask_path",(allocator<char> *)&image);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    ConfigFile::value(&mask_file_name,pCVar1,&section,(string *)local_288,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)local_288);
    image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (image_file_name._M_string_length != 0) {
      std::make_shared<SpriteFile>();
      std::__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      peVar2 = image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::operator+(&local_218,&pRVar7->path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     &local_218,&image_file_name);
      bVar3 = SpriteFile::load(peVar2,(string *)local_288);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)&local_218);
      if (bVar3) {
        ((image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase
        ).delta_x = local_25c;
        ((image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase
        ).delta_y = iVar4;
        ((image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase
        ).offset_x = iVar5;
        ((image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase
        ).offset_y = iVar6;
      }
      else {
        local_288._0_8_ = (element_type *)0x0;
        local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2> *)local_288);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      }
    }
    mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (mask_file_name._M_string_length != 0) {
      std::make_shared<SpriteFile>();
      std::__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2> *)local_288);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      peVar2 = mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::operator+(&local_218,&pRVar7->path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     &local_218,&mask_file_name);
      bVar3 = SpriteFile::load(peVar2,(string *)local_288);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)&local_218);
      if (bVar3) {
        ((mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase)
        .delta_x = local_25c;
        ((mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase)
        .delta_y = iVar4;
        ((mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase)
        .offset_x = iVar5;
        ((mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_SpriteBase)
        .offset_y = iVar6;
      }
      else {
        local_288._0_8_ = (element_type *)0x0;
        local_288._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2> *)local_288);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
      }
    }
    std::tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_>::
    tuple<std::shared_ptr<SpriteFile>_&,_std::shared_ptr<SpriteFile>_&,_true>
              ((tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_> *)local_288,&mask,
               &image);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>,_true>
              (__return_storage_ptr__,
               (tuple<std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_> *)local_288);
    std::_Tuple_impl<0UL,_std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_>::~_Tuple_impl
              ((_Tuple_impl<0UL,_std::shared_ptr<SpriteFile>,_std::shared_ptr<SpriteFile>_> *)
               local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&image.super___shared_ptr<SpriteFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&mask_file_name);
    std::__cxx11::string::~string((string *)&image_file_name);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  return __return_storage_ptr__;
}

Assistant:

Data::MaskImage
DataSourceCustom::get_sprite_parts(Data::Resource res, size_t index) {
  ResInfo *info = get_info(res);
  if (info == nullptr) {
    return std::make_tuple(nullptr, nullptr);
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string section = stream.str();

  int delta_x = info->meta->value(section, "delta_x", 0);
  int delta_y = info->meta->value(section, "delta_y", 0);
  int offset_x = info->meta->value(section, "offset_x", 0);
  int offset_y = info->meta->value(section, "offset_y", 0);
  std::string image_file_name = info->meta->value(section,
                                                  "image_path",
                                                  std::string());
  std::string mask_file_name = info->meta->value(section,
                                                 "mask_path",
                                                 std::string());

  PSpriteFile image;
  if (!image_file_name.empty()) {
    image = std::make_shared<SpriteFile>();
    if (image->load(info->path + "/" + image_file_name)) {
      image->set_delta(delta_x, delta_y);
      image->set_offset(offset_x, offset_y);
    } else {
      image = nullptr;
    }
  }

  PSpriteFile mask;
  if (!mask_file_name.empty()) {
    mask = std::make_shared<SpriteFile>();
    if (mask->load(info->path + "/" + mask_file_name)) {
      mask->set_delta(delta_x, delta_y);
      mask->set_offset(offset_x, offset_y);
    } else {
      mask = nullptr;
    }
  }

  return std::make_tuple(mask, image);
}